

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

void __thiscall tst_InsertProxyModel::testSetItemDataDataChanged(tst_InsertProxyModel *this)

{
  uint uVar1;
  QObject *parent;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined8 *puVar5;
  uint *puVar6;
  ModelTest *this_00;
  QVariant *pQVar7;
  long lVar8;
  initializer_list<std::pair<int,_QVariant>_> list;
  QMap<int,_QVariant> itemDataSet;
  anon_union_24_3_e3d07ef4_for_data local_178;
  qsizetype qStack_160;
  InsertProxyModel proxyModel;
  int iStack_154;
  QList<int> rolesVector;
  QModelIndex proxyIdX;
  value_type argList;
  QArrayDataPointer<char16_t> local_e0;
  QSignalSpy proxyDataChangeSpy;
  QArrayDataPointer<char16_t> local_48;
  
  iVar4 = qMetaTypeId<QAbstractItemModel*>();
  puVar5 = (undefined8 *)QTest::qData("baseModel",iVar4);
  parent = (QObject *)*puVar5;
  if (parent != (QObject *)0x0) {
    puVar6 = (uint *)QTest::qData("idxRow",2);
    uVar1 = *puVar6;
    QTest::qData("idxCol",2);
    QVariant::QVariant((QVariant *)&local_178,5);
    proxyDataChangeSpy._0_4_ = 0x100;
    proxyDataChangeSpy._8_8_ = local_178.shared;
    proxyDataChangeSpy.super_QList<QList<QVariant>_>.d.d = (Data *)local_178._8_8_;
    proxyDataChangeSpy.super_QList<QList<QVariant>_>.d.ptr = (QList<QVariant> *)local_178._16_8_;
    proxyDataChangeSpy.super_QList<QList<QVariant>_>.d.size = qStack_160;
    local_178._0_4_ = 0;
    local_178._4_4_ = 0;
    local_178._8_8_ = 0;
    local_178._16_8_ = 0;
    argList.d.d = (Data *)0x0;
    qStack_160 = 2;
    argList.d.ptr = (QVariant *)anon_var_dwarf_1211c;
    argList.d.size = 4;
    rolesVector.d.d = (Data *)0x0;
    rolesVector.d.ptr = (int *)0x0;
    rolesVector.d.size = 0;
    QVariant::QVariant((QVariant *)&proxyModel,(QString *)&argList);
    proxyDataChangeSpy.sig.d.d._0_4_ = 0;
    proxyDataChangeSpy.sig.d.ptr = _proxyModel;
    _proxyModel = 0;
    iStack_154 = 0;
    local_e0.d._0_4_ = 0;
    local_e0.d._4_4_ = 0;
    local_e0.ptr = L"ToolTip";
    local_e0.size = 7;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    QVariant::QVariant((QVariant *)&proxyIdX,(QString *)&local_e0);
    proxyDataChangeSpy.args.d.size._0_4_ = 3;
    proxyDataChangeSpy._88_8_ = proxyIdX._0_8_;
    proxyDataChangeSpy._96_8_ = proxyIdX.i;
    proxyDataChangeSpy._104_8_ = proxyIdX.m;
    proxyIdX.r = 0;
    proxyIdX.c = 0;
    proxyIdX.i = 0;
    proxyIdX.m = (QAbstractItemModel *)0x0;
    list._M_len = 3;
    list._M_array = (iterator)&proxyDataChangeSpy;
    QMap<int,_QVariant>::QMap(&itemDataSet,list);
    lVar8 = 0x58;
    do {
      QVariant::~QVariant((QVariant *)(&proxyDataChangeSpy.super_QObject + lVar8));
      lVar8 = lVar8 + -0x28;
    } while (lVar8 != -0x20);
    QVariant::~QVariant((QVariant *)&proxyIdX);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QVariant::~QVariant((QVariant *)&proxyModel);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&argList);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rolesVector);
    QVariant::~QVariant((QVariant *)&local_178);
    InsertProxyModel::InsertProxyModel(&proxyModel,(QObject *)0x0);
    this_00 = (ModelTest *)operator_new(0x10);
    ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,parent);
    InsertProxyModel::setMergeDisplayEdit(SUB81(&proxyModel,0));
    proxyDataChangeSpy._0_4_ = 3;
    InsertProxyModel::setInsertDirection(&proxyModel);
    InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
    proxyDataChangeSpy.super_QObject = (QObject)0xff;
    proxyDataChangeSpy._1_7_ = 0xffffffffffffff;
    proxyDataChangeSpy._8_8_ = 0;
    proxyDataChangeSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
    InsertProxyModel::index((int)&proxyIdX,(int)&proxyModel,(QModelIndex *)(ulong)uVar1);
    QVariant::QVariant((QVariant *)&proxyDataChangeSpy,2);
    bVar2 = (bool)InsertProxyModel::setData
                            ((QModelIndex *)&proxyModel,(QVariant *)&proxyIdX,
                             (int)&proxyDataChangeSpy);
    cVar3 = QTest::qVerify(bVar2,
                           "proxyModel.setData(proxyIdX, Qt::AlignRight, Qt::TextAlignmentRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x351);
    QVariant::~QVariant((QVariant *)&proxyDataChangeSpy);
    if (cVar3 != '\0') {
      QSignalSpy::QSignalSpy
                (&proxyDataChangeSpy,(QObject *)&proxyModel,
                 "2dataChanged(QModelIndex, QModelIndex, QVector<int>)");
      bVar2 = (bool)InsertProxyModel::setItemData((QModelIndex *)&proxyModel,(QMap *)&proxyIdX);
      cVar3 = QTest::qVerify(bVar2,"proxyModel.setItemData(proxyIdX, itemDataSet)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x353);
      if (cVar3 != '\0') {
        cVar3 = QTest::qCompare(proxyDataChangeSpy.super_QList<QList<QVariant>_>.d.size,1,
                                "proxyDataChangeSpy.size()","1",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                ,0x354);
        if (cVar3 != '\0') {
          QList<QList<QVariant>_>::takeFirst
                    (&argList,&proxyDataChangeSpy.super_QList<QList<QVariant>_>);
          qvariant_cast<QModelIndex>((QModelIndex *)&local_178,argList.d.ptr);
          bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                            ((QModelIndex *)&local_178,&proxyIdX,
                             "argList.at(0).value<QModelIndex>()","proxyIdX",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x356);
          if (bVar2) {
            qvariant_cast<QModelIndex>((QModelIndex *)&local_178,argList.d.ptr + 1);
            bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                              ((QModelIndex *)&local_178,&proxyIdX,
                               "argList.at(1).value<QModelIndex>()","proxyIdX",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                               ,0x357);
            if (bVar2) {
              qvariant_cast<QList<int>>(&rolesVector,argList.d.ptr + 2);
              cVar3 = QTest::qCompare(rolesVector.d.size,4,"rolesVector.size()","4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                      ,0x35a);
              if (cVar3 != '\0') {
                local_178._0_4_ = 7;
                bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                  ((QListSpecialMethodsBase<int> *)&rolesVector,
                                   (ItemDataRole *)local_178.data);
                cVar3 = QTest::qVerify(!bVar2,"!rolesVector.contains(Qt::TextAlignmentRole)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                       ,0x35b);
                if (cVar3 != '\0') {
                  local_178._0_4_ = 3;
                  bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                    ((QListSpecialMethodsBase<int> *)&rolesVector,
                                     (ItemDataRole *)local_178.data);
                  cVar3 = QTest::qVerify(bVar2,"rolesVector.contains(Qt::ToolTipRole)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                         ,0x35d);
                  if (cVar3 != '\0') {
                    local_178._0_4_ = 2;
                    bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                      ((QListSpecialMethodsBase<int> *)&rolesVector,
                                       (ItemDataRole *)local_178.data);
                    cVar3 = QTest::qVerify(bVar2,"rolesVector.contains(Qt::EditRole)","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                           ,0x35e);
                    if (cVar3 != '\0') {
                      local_178._0_4_ = 0;
                      bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                        ((QListSpecialMethodsBase<int> *)&rolesVector,
                                         (ItemDataRole *)local_178.data);
                      cVar3 = QTest::qVerify(bVar2,"rolesVector.contains(Qt::DisplayRole)","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                             ,0x35f);
                      if (cVar3 != '\0') {
                        local_178._0_4_ = 0x100;
                        bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                          ((QListSpecialMethodsBase<int> *)&rolesVector,
                                           (ItemDataRole *)local_178.data);
                        cVar3 = QTest::qVerify(bVar2,"rolesVector.contains(Qt::UserRole)","",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                               ,0x360);
                        if (cVar3 != '\0') {
                          QVariant::QVariant((QVariant *)&local_178,6);
                          local_e0.d._0_4_ = 0x100;
                          pQVar7 = QMap<int,_QVariant>::operator[](&itemDataSet,(int *)&local_e0);
                          QVariant::operator=(pQVar7,(QVariant *)&local_178);
                          QVariant::~QVariant((QVariant *)&local_178);
                          bVar2 = (bool)InsertProxyModel::setItemData
                                                  ((QModelIndex *)&proxyModel,(QMap *)&proxyIdX);
                          cVar3 = QTest::qVerify(bVar2,
                                                 "proxyModel.setItemData(proxyIdX, itemDataSet)","",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                 ,0x362);
                          if (cVar3 != '\0') {
                            cVar3 = QTest::qCompare(proxyDataChangeSpy.super_QList<QList<QVariant>_>
                                                    .d.size,1,"proxyDataChangeSpy.size()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x363);
                            if (cVar3 != '\0') {
                              QList<QList<QVariant>_>::takeFirst
                                        ((value_type *)&local_178,
                                         &proxyDataChangeSpy.super_QList<QList<QVariant>_>);
                              QArrayDataPointer<QVariant>::operator=
                                        (&argList.d,(QArrayDataPointer<QVariant> *)&local_178);
                              QArrayDataPointer<QVariant>::~QArrayDataPointer
                                        ((QArrayDataPointer<QVariant> *)&local_178);
                              qvariant_cast<QModelIndex>((QModelIndex *)&local_178,argList.d.ptr);
                              bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                ((QModelIndex *)&local_178,&proxyIdX,
                                                 "argList.at(0).value<QModelIndex>()","proxyIdX",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                 ,0x365);
                              if (bVar2) {
                                qvariant_cast<QModelIndex>
                                          ((QModelIndex *)&local_178,argList.d.ptr + 1);
                                bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                  ((QModelIndex *)&local_178,&proxyIdX,
                                                   "argList.at(1).value<QModelIndex>()","proxyIdX",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x366);
                                if (bVar2) {
                                  qvariant_cast<QList<int>>
                                            ((QList<int> *)&local_178,argList.d.ptr + 2);
                                  QArrayDataPointer<int>::operator=
                                            (&rolesVector.d,(QArrayDataPointer<int> *)&local_178);
                                  QArrayDataPointer<int>::~QArrayDataPointer
                                            ((QArrayDataPointer<int> *)&local_178);
                                  cVar3 = QTest::qCompare(rolesVector.d.size,1,"rolesVector.size()",
                                                          "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x368);
                                  if (cVar3 != '\0') {
                                    local_178._0_4_ = 0x100;
                                    bVar2 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                                      ((QListSpecialMethodsBase<int> *)&rolesVector,
                                                       (ItemDataRole *)local_178.data);
                                    cVar3 = QTest::qVerify(bVar2,
                                                  "rolesVector.contains(Qt::UserRole)","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x369);
                                    if (cVar3 != '\0') {
                                      QMap<int,_QVariant>::clear(&itemDataSet);
                                      QVariant::QVariant((QVariant *)&local_178,6);
                                      local_e0.d._0_4_ = 0x100;
                                      pQVar7 = QMap<int,_QVariant>::operator[]
                                                         (&itemDataSet,(int *)&local_e0);
                                      QVariant::operator=(pQVar7,(QVariant *)&local_178);
                                      QVariant::~QVariant((QVariant *)&local_178);
                                      bVar2 = (bool)InsertProxyModel::setItemData
                                                              ((QModelIndex *)&proxyModel,
                                                               (QMap *)&proxyIdX);
                                      cVar3 = QTest::qVerify(bVar2,
                                                  "proxyModel.setItemData(proxyIdX, itemDataSet)",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x36c);
                                      if (cVar3 != '\0') {
                                        cVar3 = QTest::qCompare(proxyDataChangeSpy.
                                                                super_QList<QList<QVariant>_>.d.size
                                                                ,0,"proxyDataChangeSpy.size()","0",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x36e);
                                        if (cVar3 != '\0') {
                                          QObject::deleteLater();
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              QArrayDataPointer<int>::~QArrayDataPointer(&rolesVector.d);
            }
          }
          QArrayDataPointer<QVariant>::~QArrayDataPointer(&argList.d);
        }
      }
      QSignalSpy::~QSignalSpy(&proxyDataChangeSpy);
    }
    InsertProxyModel::~InsertProxyModel(&proxyModel);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&itemDataSet.d);
  }
  return;
}

Assistant:

void tst_InsertProxyModel::testSetItemDataDataChanged()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(int, idxRow);
    QFETCH(int, idxCol);
    QMap<int, QVariant> itemDataSet{{// TextAlignmentRole
                                     std::make_pair<int, QVariant>(Qt::UserRole, 5),
                                     std::make_pair<int, QVariant>(Qt::DisplayRole, QStringLiteral("Test")),
                                     std::make_pair<int, QVariant>(Qt::ToolTipRole, QStringLiteral("ToolTip"))}};
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setMergeDisplayEdit(true);
    proxyModel.setInsertDirection(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(baseModel);
    const QModelIndex proxyIdX = proxyModel.index(idxRow, idxCol);
    QVERIFY(proxyModel.setData(proxyIdX, Qt::AlignRight, Qt::TextAlignmentRole));
    QSignalSpy proxyDataChangeSpy(&proxyModel, SIGNAL(dataChanged(QModelIndex, QModelIndex, QVector<int>)));
    QVERIFY(proxyModel.setItemData(proxyIdX, itemDataSet));
    QCOMPARE(proxyDataChangeSpy.size(), 1);
    auto argList = proxyDataChangeSpy.takeFirst();
    QCOMPARE(argList.at(0).value<QModelIndex>(), proxyIdX);
    QCOMPARE(argList.at(1).value<QModelIndex>(), proxyIdX);
    auto rolesVector = argList.at(2).value<QVector<int>>();
#ifndef SKIP_QTBUG_45114
    QCOMPARE(rolesVector.size(), 4);
    QVERIFY(!rolesVector.contains(Qt::TextAlignmentRole));
#endif
    QVERIFY(rolesVector.contains(Qt::ToolTipRole));
    QVERIFY(rolesVector.contains(Qt::EditRole));
    QVERIFY(rolesVector.contains(Qt::DisplayRole));
    QVERIFY(rolesVector.contains(Qt::UserRole));
    itemDataSet[Qt::UserRole] = 6;
    QVERIFY(proxyModel.setItemData(proxyIdX, itemDataSet));
    QCOMPARE(proxyDataChangeSpy.size(), 1);
    argList = proxyDataChangeSpy.takeFirst();
    QCOMPARE(argList.at(0).value<QModelIndex>(), proxyIdX);
    QCOMPARE(argList.at(1).value<QModelIndex>(), proxyIdX);
    rolesVector = argList.at(2).value<QVector<int>>();
    QCOMPARE(rolesVector.size(), 1);
    QVERIFY(rolesVector.contains(Qt::UserRole));
    itemDataSet.clear();
    itemDataSet[Qt::UserRole] = 6;
    QVERIFY(proxyModel.setItemData(proxyIdX, itemDataSet));
#ifndef SKIP_QTBUG_45114
    QCOMPARE(proxyDataChangeSpy.size(), 0);
#endif
    baseModel->deleteLater();
}